

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::anon_unknown_1::BasicResetCase::passAndLog
          (BasicResetCase *this,
          SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> *contextReset)

{
  ostringstream *this_00;
  GLenum GVar1;
  char *description;
  Enum<int,_2UL> local_1b8;
  Enum<int,_2UL> local_1a8;
  undefined1 local_198 [384];
  
  GVar1 = (*contextReset->m_ptr->m_gl->getGraphicsResetStatus)();
  if (GVar1 != 0) {
    GVar1 = (*contextReset->m_ptr->m_gl->getError)();
    if (GVar1 == 0) {
      description = "Pass";
    }
    else {
      description = "Error flag not reset after calling getGraphicsResetStatus()";
    }
    tcu::TestContext::setTestResult
              ((this->super_ContextResetCase).super_RobustnessTestCase.super_TestCase.super_TestCase
               .super_TestNode.m_testCtx,(uint)(GVar1 != 0),description);
    return;
  }
  local_198._0_8_ =
       ((this->super_ContextResetCase).super_RobustnessTestCase.super_TestCase.super_TestCase.
        super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Test failed! glGetGraphicsResetStatus() returned wrong value [",
             0x3e);
  local_1a8.m_getName = glu::getGraphicsResetStatusName;
  local_1a8.m_value = 0;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1a8,(ostream *)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", expected ",0xb);
  local_1b8.m_getName = glu::getGraphicsResetStatusName;
  local_1b8.m_value = 0x8253;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x78));
  tcu::TestContext::setTestResult
            ((this->super_ContextResetCase).super_RobustnessTestCase.super_TestCase.super_TestCase.
             super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
  return;
}

Assistant:

virtual void passAndLog (de::SharedPtr<ContextReset>& contextReset)
	{
		const glw::GLint status = contextReset->getGraphicsResetStatus();

		if (status == GL_NO_ERROR)
		{
			m_testCtx.getLog()	<< tcu::TestLog::Message
								<< "Test failed! glGetGraphicsResetStatus() returned wrong value [" << glu::getGraphicsResetStatusStr(status) << ", expected " << glu::getGraphicsResetStatusStr(GL_GUILTY_CONTEXT_RESET) << "]"
								<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
		else
		{
			if (contextReset->getError() != GL_NO_ERROR)
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Error flag not reset after calling getGraphicsResetStatus()");
			else
				m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		}
	}